

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arm.cpp
# Opt level: O3

bool ArmGetRlist(char *source,int *RetLen,int ValidRegisters,int *Result)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int i;
  uint uVar6;
  
  uVar6 = 0;
  iVar3 = 0;
  do {
    uVar2 = ArmGetRegister(source + iVar3,RetLen);
    if (uVar2 == 0xffffffff) {
      return false;
    }
    uVar5 = (long)*RetLen + (long)iVar3;
    cVar1 = source[uVar5];
    if (cVar1 == '-') {
      iVar3 = ArmGetRegister(source + uVar5 + 1,RetLen);
      if (iVar3 == -1) {
        return false;
      }
      if (iVar3 < (int)uVar2) {
        return false;
      }
      uVar4 = (int)uVar5 + *RetLen + 1;
      uVar5 = (ulong)uVar4;
      do {
        if (((uint)ValidRegisters >> (uVar2 & 0x1f) & 1) == 0) {
          return false;
        }
        uVar6 = uVar6 | 1 << ((byte)uVar2 & 0x1f);
        uVar2 = uVar2 + 1;
      } while (iVar3 + 1U != uVar2);
      cVar1 = source[(int)uVar4];
    }
    else {
      if (((uint)ValidRegisters >> (uVar2 & 0x1f) & 1) == 0) {
        return false;
      }
      uVar6 = uVar6 | 1 << ((byte)uVar2 & 0x1f);
    }
    iVar3 = (int)uVar5 + 1;
    if (cVar1 != ',') {
      *RetLen = (int)uVar5;
      *Result = uVar6;
      return true;
    }
  } while( true );
}

Assistant:

bool ArmGetRlist(char* source, int& RetLen, int ValidRegisters, int& Result)
{
	int len = 0;

	int list = 0;
	while (true)
	{
		int num = ArmGetRegister(&source[len],RetLen);
		if (num == -1) return false;
		len += RetLen;

		if (source[len] == '-')
		{
			int num2 = ArmGetRegister(&source[len+1],RetLen);
			if (num2 == -1 || num2 < num) return false;
			len += (RetLen+1);
			for (int i = num; i <= num2; i++)
			{
				if ((ValidRegisters & (1 << i)) == 0) return false;
				list |= (1 << i);
			}
		} else {
			if ((ValidRegisters & (1 << num)) == 0) return false;
			list |= (1 << num);
		}
		if (source[len] != ',') break;
		len++;
	}

	RetLen = len;
	Result = list;
	return true;
}